

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmMull<(moira::Instr)156,(moira::Mode)0,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  undefined8 in_RAX;
  StrWriter *this_00;
  char *str_00;
  bool bVar2;
  undefined8 local_38;
  
  local_38 = CONCAT44((int)((ulong)in_RAX >> 0x20),*addr);
  uVar1 = dasmIncRead<2>(this,addr);
  bVar2 = (str->style->syntax & ~MOIRA_MIT) == GNU;
  str_00 = ":";
  if (bVar2) {
    str_00 = ",";
  }
  if ((uVar1 & 0x83f8) == 0 || !bVar2) {
    if ((uVar1 >> 0xb & 1) == 0) {
      StrWriter::operator<<();
    }
    else {
      StrWriter::operator<<(str);
    }
    this_00 = StrWriter::operator<<(str);
    StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
    StrWriter::operator<<(this_00,(Dn)(op & 7));
    StrWriter::operator<<(this_00);
    if ((uVar1 >> 10 & 1) != 0) {
      StrWriter::operator<<(str,(Dn)(uVar1 & 7));
      StrWriter::operator<<(str,str_00);
    }
    StrWriter::operator<<(str,(Dn)(uVar1 >> 0xc & 7));
    local_38 = local_38 & 0xffffffff;
    StrWriter::operator<<(str,(Av<(moira::Instr)156,_(moira::Mode)0,_4> *)((long)&local_38 + 4));
    return;
  }
  *addr = (u32)local_38;
  dasmIllegal<(moira::Instr)156,(moira::Mode)0,4>(this,str,addr,op);
  return;
}

Assistant:

void
Moira::dasmMull(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dl  = Dn       ( _xxx____________(ext)      );
    auto dh  = Dn       ( _____________xxx(ext)      );

    auto fill = str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT ? "," : ":";

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            // Catch illegal extension words
            if (!isValidExt(I, M, op, ext)) {

                addr = old;
                dasmIllegal<I, M, S>(str, addr, op);
                return;
            }
            [[fallthrough]];

        default:

            (ext & 1 << 11) ? str << Ins<Instr::MULS>{} : str << Ins<Instr::MULU>{};
            str << Sz<S>{} << str.tab << src << Sep{};
            (ext & 1 << 10) ? str << dh << fill << dl : str << dl;
            str << Av<I, M, S>{};
    }
}